

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O2

void print_learned_mocks(void)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  TestReporter *pTVar3;
  undefined8 *puVar4;
  void *pvVar5;
  int local_38;
  int i;
  
  _local_38 = (ulong)in_EAX;
  pTVar3 = get_test_reporter();
  walk_breadcrumb(pTVar3->breadcrumb,show_breadcrumb,&i);
  __fprintf_chk(_stderr,1,": Learned mocks are\n");
  iVar1 = cgreen_vector_size(learned_mock_calls);
  if (iVar1 == 0) {
    __fprintf_chk(_stderr,1,"\t<none>\n");
  }
  else {
    iVar1 = 0;
    while( true ) {
      iVar2 = cgreen_vector_size(learned_mock_calls);
      if (iVar2 <= iVar1) break;
      _local_38 = CONCAT44(i,iVar1);
      puVar4 = (undefined8 *)cgreen_vector_get(learned_mock_calls,iVar1);
      iVar1 = 0;
      __fprintf_chk(_stderr,1,"\texpect(%s",*puVar4);
      while( true ) {
        iVar2 = cgreen_vector_size((CgreenVector *)puVar4[3]);
        if (iVar2 <= iVar1) break;
        pvVar5 = cgreen_vector_get((CgreenVector *)puVar4[3],iVar1);
        if (*(int *)((long)pvVar5 + 0x40) == 2) {
          __fprintf_chk(*(undefined8 *)((long)pvVar5 + 0x48),_stderr,1,
                        ", when(%s, is_equal_to_double(%f))",*(undefined8 *)((long)pvVar5 + 0x58));
        }
        else {
          __fprintf_chk(_stderr,1,", when(%s, is_equal_to(%ld))",
                        *(undefined8 *)((long)pvVar5 + 0x58),*(undefined8 *)((long)pvVar5 + 0x48));
        }
        iVar1 = iVar1 + 1;
      }
      __fprintf_chk(_stderr,1,");\n");
      iVar1 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void print_learned_mocks(void) {
    int e, c, i = 0;
    CgreenBreadcrumb *breadcrumb = get_test_reporter()->breadcrumb;

    walk_breadcrumb(breadcrumb, &show_breadcrumb, (void *) &i);

    fprintf(stderr, ": Learned mocks are\n");

    if (cgreen_vector_size(learned_mock_calls) == 0) {
        fprintf(stderr, "\t<none>\n");
        return;
    }

    for (e = 0; e < cgreen_vector_size(learned_mock_calls); e++) {
        RecordedExpectation *expectation = (RecordedExpectation*)cgreen_vector_get(learned_mock_calls, e);
        const char *function_name = expectation->function;
        fprintf(stderr, "\texpect(%s", function_name);
        for (c = 0; c < cgreen_vector_size(expectation->constraints); c++) {
            Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, c);
            if (constraint->expected_value.type == CGREEN_DOUBLE)
                fprintf(stderr, ", when(%s, is_equal_to_double(%f))", constraint->expected_value_name,
                        constraint->expected_value.value.double_value);
            else
                fprintf(stderr, ", when(%s, is_equal_to(%" PRIdPTR "))", constraint->expected_value_name,
                        constraint->expected_value.value.integer_value);
        }
        fprintf(stderr, ");\n");
    }
}